

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O1

void __thiscall depspawn::internal::arg_info::insert_in_arglist(arg_info *this,arg_info **args)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  arg_info *paVar4;
  bool bVar5;
  arg_info *paStack_8;
  
  paVar4 = *args;
  if (paVar4 != (arg_info *)0x0) {
    uVar3 = this->addr;
    if (paVar4->addr <= uVar3) {
      do {
        paStack_8 = paVar4;
        paVar4 = paStack_8->next;
        if (paVar4 == (arg_info *)0x0) {
          if ((this->rank != '\0') || (this->addr != paStack_8->addr)) {
            paStack_8->next = this;
            return;
          }
          goto depspawn_internal_arg_info_solve_overlap;
        }
      } while (paVar4->addr <= uVar3);
      if ((this->rank != '\0') || (uVar3 != paStack_8->addr)) {
        paStack_8->next = this;
        this->next = paVar4;
        return;
      }
depspawn_internal_arg_info_solve_overlap:
      bVar5 = true;
      if (this->wr == false) {
        bVar5 = paStack_8->wr;
      }
      uVar3 = this->size;
      uVar2 = paStack_8->size;
      if (uVar3 - uVar2 == 0) {
        paStack_8->wr = bVar5;
        paVar4 = (arg_info *)Pool._32_8_;
        do {
          this->next = paVar4;
          LOCK();
          bVar5 = paVar4 != (arg_info *)Pool._32_8_;
          uVar3 = ((ulong)paVar4 & 0xffff000000000000) + 0x1000000000000 | (ulong)this;
          if (bVar5) {
            paVar4 = (arg_info *)Pool._32_8_;
            uVar3 = Pool._32_8_;
          }
          Pool._32_8_ = uVar3;
          UNLOCK();
        } while (bVar5);
      }
      else {
        if (uVar3 < uVar2) {
          bVar1 = paStack_8->wr;
          paVar4 = (arg_info *)Pool._32_8_;
          if (bVar5 == bVar1) {
            do {
              this->next = paVar4;
              LOCK();
              bVar5 = paVar4 != (arg_info *)Pool._32_8_;
              uVar3 = ((ulong)paVar4 & 0xffff000000000000) + 0x1000000000000 | (ulong)this;
              if (bVar5) {
                paVar4 = (arg_info *)Pool._32_8_;
                uVar3 = Pool._32_8_;
              }
              Pool._32_8_ = uVar3;
              UNLOCK();
            } while (bVar5);
            return;
          }
          this->addr = this->addr + uVar3;
          this->size = uVar2 - uVar3;
          this->wr = bVar1;
          paStack_8->size = uVar3;
          paStack_8->wr = bVar5;
        }
        else {
          if (this->wr == bVar5) {
            paStack_8->wr = bVar5;
            paStack_8->size = uVar3;
            paVar4 = (arg_info *)Pool._32_8_;
            do {
              this->next = paVar4;
              LOCK();
              bVar5 = paVar4 != (arg_info *)Pool._32_8_;
              uVar3 = ((ulong)paVar4 & 0xffff000000000000) + 0x1000000000000 | (ulong)this;
              if (bVar5) {
                paVar4 = (arg_info *)Pool._32_8_;
                uVar3 = Pool._32_8_;
              }
              Pool._32_8_ = uVar3;
              UNLOCK();
            } while (bVar5);
            return;
          }
          this->addr = this->addr + uVar2;
          this->size = uVar3 - uVar2;
        }
        insert_in_arglist(this,&paStack_8);
      }
      return;
    }
    this->next = paVar4;
  }
  *args = this;
  return;
}

Assistant:

void arg_info::insert_in_arglist(arg_info*& args)
    { arg_info *p, *prev;
      
      if(!args) {
	args = this;
      } else if(addr < args->addr) {
	next = args;
	args = this;
      } else {
	
	prev = args;
	p = args->next;
	while(p) {
	  if(addr < p->addr) {
	    if( !is_array() && (addr == prev->addr) ) //Arrays are inserted replicated
	      solve_overlap(prev);
	    else {
	      prev->next = this;
	      next = p;
	    }
	    break;
	  }
	  prev = p;
	  p = p->next;
	}
	
        if(!p) {
          if( !is_array() && (addr == prev->addr) ) { //Arrays are inserted replicated
	    solve_overlap(prev);
          } else {
	    prev->next = this;
          }
        }
      }
      
    }